

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatFile.h
# Opt level: O2

void __thiscall
FlatFile<int,_int>::FlatFile
          (FlatFile<int,_int> *this,ion_dictionary_id_t id,ion_key_type_t key_type,
          ion_key_size_t key_size,ion_value_size_t value_size,ion_dictionary_size_t dictionary_size)

{
  ffdict_init((ion_dictionary_handler_t *)this);
  Dictionary<int,_int>::initializeDictionary
            (&this->super_Dictionary<int,_int>,id,key_type,key_size,value_size,dictionary_size);
  return;
}

Assistant:

FlatFile(
	ion_dictionary_id_t		id,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	ion_dictionary_size_t	dictionary_size
) {
	ffdict_init(&this->handler);

	this->initializeDictionary(id, key_type, key_size, value_size, dictionary_size);
}